

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_service_client(t_dart_generator *this,t_service *tservice)

{
  string *__lhs;
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_struct *ptVar2;
  int iVar3;
  ostream *poVar4;
  pointer pptVar5;
  pointer pptVar6;
  char *pcVar7;
  t_dart_generator *ptVar8;
  string argsname;
  string class_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_client;
  string extends;
  string result_field_name;
  string arg_field_name;
  allocator local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  pointer local_380;
  string local_378;
  t_struct *local_358;
  pointer local_350;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_348;
  allocator local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_310,"",local_330);
  std::__cxx11::string::string((string *)local_330,"",(allocator *)&local_378);
  if (tservice->extends_ != (t_service *)0x0) {
    get_ttype_class_name_abi_cxx11_(&local_378,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_310,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::operator+(&local_3a0," extends ",&local_310);
    std::operator+(&local_378,&local_3a0,"Client");
    std::__cxx11::string::operator=((string *)local_330,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  __lhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&local_378,__lhs,"Client");
  ptVar8 = (t_dart_generator *)__lhs;
  std::__cxx11::string::string((string *)&local_250,(string *)__lhs);
  get_file_name(&local_230,ptVar8,&local_250);
  std::__cxx11::string::string((string *)&local_270,(string *)&local_378);
  export_class_to_library(this,&local_230,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  os = &this->f_service_;
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar4 = std::operator<<(poVar4,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&local_378);
  poVar4 = std::operator<<(poVar4,(string *)local_330);
  poVar4 = std::operator<<(poVar4," implements ");
  std::operator<<(poVar4,(string *)__lhs);
  std::__cxx11::string::string((string *)&local_290," ",(allocator *)&local_3a0);
  scope_up(this,(ostream *)os,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar4 = std::operator<<(poVar4,(string *)&local_378);
  std::operator<<(poVar4,"(TProtocol iprot, [TProtocol oprot = null])");
  if (local_310._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_2b0," ",(allocator *)&local_3a0);
    scope_up(this,(ostream *)os,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"_iprot = iprot;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"_oprot = (oprot == null) ? iprot : oprot;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_2d0,(string *)&::endl_abi_cxx11_);
    scope_down(this,(ostream *)os,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,": super(iprot, oprot);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  if (local_310._M_string_length == 0) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"TProtocol _iprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"TProtocol get iprot => _iprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"TProtocol _oprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"TProtocol get oprot => _oprot;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"int _seqid = 0;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"int get seqid => _seqid;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"int nextSeqid() => ++_seqid;");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_348,&tservice->functions_
            );
  for (pptVar6 = local_348._M_impl.super__Vector_impl_data._M_start;
      pptVar6 != local_348._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    function_signature_abi_cxx11_(&local_3a0,this,*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)&local_3a0);
    std::operator<<(poVar4," async");
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::string((string *)&local_90," ",(allocator *)&local_3a0);
    scope_up(this,(ostream *)os,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    ptVar2 = (*pptVar6)->arglist_;
    std::__cxx11::string::string((string *)&local_b0,(string *)&(*pptVar6)->name_);
    std::operator+(&local_3a0,&local_b0,"_args");
    std::__cxx11::string::~string((string *)&local_b0);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"oprot.writeMessageBegin(new TMessage(\"");
    poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
    poVar4 = std::operator<<(poVar4,"\", ");
    pcVar7 = "TMessageType.CALL";
    if ((*pptVar6)->oneway_ != false) {
      pcVar7 = "TMessageType.ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,", nextSeqid()));");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,(string *)&local_3a0);
    poVar4 = std::operator<<(poVar4," args = new ");
    poVar4 = std::operator<<(poVar4,(string *)&local_3a0);
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    local_380 = pptVar6;
    for (pptVar5 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      ptVar8 = (t_dart_generator *)&(*pptVar5)->name_;
      std::__cxx11::string::string((string *)&local_50,(string *)ptVar8);
      get_member_name(&local_150,ptVar8,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"args.");
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
    }
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    pptVar6 = local_380;
    poVar4 = std::operator<<(poVar4,"args.write(oprot);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"oprot.writeMessageEnd();");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"await oprot.transport.flush();");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    if ((*pptVar6)->oneway_ == false) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"TMessage msg = iprot.readMessageBegin();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::operator<<(poVar4,"if (msg.type == TMessageType.EXCEPTION)");
      std::__cxx11::string::string((string *)&local_d0," ",(allocator *)&local_150);
      scope_up(this,(ostream *)os,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"TApplicationError error = TApplicationError.read(iprot);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"throw error;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_170,(string *)&endl2_abi_cxx11_);
      scope_down(this,(ostream *)os,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::string((string *)&local_f0,(string *)&(*pptVar6)->name_);
      std::operator+(&local_150,&local_f0,"_result");
      std::__cxx11::string::~string((string *)&local_f0);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4," result = new ");
      poVar4 = std::operator<<(poVar4,(string *)&local_150);
      poVar4 = std::operator<<(poVar4,"();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"result.read(iprot);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"iprot.readMessageEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      iVar3 = (*((*pptVar6)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar3 == '\0') {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,"if (result.");
        ptVar8 = (t_dart_generator *)0x2f8d6c;
        std::__cxx11::string::string((string *)&local_1b0,"success",&local_3a1);
        generate_isset_check(&local_190,ptVar8,&local_1b0);
        poVar4 = std::operator<<(poVar4,(string *)&local_190);
        std::operator<<(poVar4,")");
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::string((string *)&local_110," ",(allocator *)&local_190);
        scope_up(this,(ostream *)os,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,"return result.success;");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&endl2_abi_cxx11_);
        scope_down(this,(ostream *)os,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      local_358 = (*pptVar6)->xceptions_;
      pptVar5 = (local_358->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (pptVar6 = local_380,
            pptVar5 !=
            (local_358->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
        ptVar8 = (t_dart_generator *)&(*pptVar5)->name_;
        local_350 = pptVar5;
        std::__cxx11::string::string((string *)&local_70,(string *)ptVar8);
        get_member_name(&local_190,ptVar8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,"if (result.");
        poVar4 = std::operator<<(poVar4,(string *)&local_190);
        std::operator<<(poVar4," != null)");
        std::__cxx11::string::string((string *)&local_130," ",&local_3a1);
        scope_up(this,(ostream *)os,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,"throw result.");
        poVar4 = std::operator<<(poVar4,(string *)&local_190);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&::endl_abi_cxx11_);
        scope_down(this,(ostream *)os,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_190);
        pptVar5 = local_350 + 1;
      }
      iVar3 = (*((*local_380)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar3 == '\0') {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,
                                 "throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \""
                                );
        poVar4 = std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
        pcVar7 = " failed: unknown result\");";
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        pcVar7 = "return;";
      }
      poVar4 = std::operator<<(poVar4,pcVar7);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::string((string *)&local_210,(string *)&endl2_abi_cxx11_);
    scope_down(this,(ostream *)os,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  std::__cxx11::string::string((string *)&local_2f0,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)os,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_348);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)&local_310);
  return;
}

Assistant:

void t_dart_generator::generate_service_client(t_service* tservice) {
  string extends = "";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = get_ttype_class_name(tservice->get_extends());
    extends_client = " extends " + extends + "Client";
  }

  string class_name = service_name_ + "Client";
  export_class_to_library(get_file_name(service_name_), class_name);
  indent(f_service_) << "class " << class_name << extends_client
                     << " implements " << service_name_;
  scope_up(f_service_);
  f_service_ << endl;

  indent(f_service_) << class_name << "(TProtocol iprot, [TProtocol oprot = null])";

  if (!extends.empty()) {
    indent_up();
    f_service_ << endl;
    indent(f_service_) << ": super(iprot, oprot);" << endl;
    indent_down();
  } else {
    scope_up(f_service_);
    indent(f_service_) << "_iprot = iprot;" << endl;
    indent(f_service_) << "_oprot = (oprot == null) ? iprot : oprot;" << endl;
    scope_down(f_service_);
  }
  f_service_ << endl;

  if (extends.empty()) {
    indent(f_service_) << "TProtocol _iprot;" << endl2;
    indent(f_service_) << "TProtocol get iprot => _iprot;" << endl2;
    indent(f_service_) << "TProtocol _oprot;" << endl2;
    indent(f_service_) << "TProtocol get oprot => _oprot;" << endl2;
    indent(f_service_) << "int _seqid = 0;" << endl2;
    indent(f_service_) << "int get seqid => _seqid;" << endl2;
    indent(f_service_) << "int nextSeqid() => ++_seqid;" << endl2;
  }

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    // Open function
    indent(f_service_) << function_signature(*f_iter) << " async";
    scope_up(f_service_);

    // Get the struct of function call params
    t_struct* arg_struct = (*f_iter)->get_arglist();

    string argsname = get_args_class_name((*f_iter)->get_name());
    vector<t_field*>::const_iterator fld_iter;
    const vector<t_field*>& fields = arg_struct->get_members();

    // Serialize the request
    indent(f_service_) << "oprot.writeMessageBegin(new TMessage(\"" << (*f_iter)->get_name() << "\", "
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
               << ", nextSeqid()));" << endl;
    indent(f_service_) << argsname << " args = new " << argsname << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      string arg_field_name = get_member_name((*fld_iter)->get_name());
      indent(f_service_) << "args." << arg_field_name << " = "
                 << arg_field_name << ";" << endl;
    }

    indent(f_service_) << "args.write(oprot);" << endl;
    indent(f_service_) << "oprot.writeMessageEnd();" << endl2;

    indent(f_service_) << "await oprot.transport.flush();" << endl2;

    if (!(*f_iter)->is_oneway()) {
      indent(f_service_) << "TMessage msg = iprot.readMessageBegin();" << endl;
      indent(f_service_) << "if (msg.type == TMessageType.EXCEPTION)";
      scope_up(f_service_);
      indent(f_service_) << "TApplicationError error = TApplicationError.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;
      indent(f_service_) << "throw error;" << endl;
      scope_down(f_service_, endl2);

      string result_class = get_result_class_name((*f_iter)->get_name());
      indent(f_service_) << result_class << " result = new " << result_class << "();" << endl;
      indent(f_service_) << "result.read(iprot);" << endl;
      indent(f_service_) << "iprot.readMessageEnd();" << endl;

      // Careful, only return _result if not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "if (result." << generate_isset_check("success") << ")";
        scope_up(f_service_);
        indent(f_service_) << "return result.success;" << endl;
        scope_down(f_service_, endl2);
      }

      t_struct* xs = (*f_iter)->get_xceptions();
      const std::vector<t_field*>& xceptions = xs->get_members();
      vector<t_field*>::const_iterator x_iter;
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        string result_field_name = get_member_name((*x_iter)->get_name());
        indent(f_service_) << "if (result." << result_field_name << " != null)";
        scope_up(f_service_);
        indent(f_service_) << "throw result." << result_field_name << ";" << endl;
        scope_down(f_service_);
      }

      // If you get here it's an exception, unless a void function
      if ((*f_iter)->get_returntype()->is_void()) {
        indent(f_service_) << "return;" << endl;
      } else {
        indent(f_service_) << "throw new TApplicationError(TApplicationErrorType.MISSING_RESULT, \""
                   << (*f_iter)->get_name() << " failed: unknown result\");" << endl;
      }
    }

    scope_down(f_service_, endl2);
  }

  scope_down(f_service_, endl2);
}